

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_decompressionMargin(void *src,size_t srcSize)

{
  size_t sVar1;
  unsigned_long_long uVar2;
  size_t sVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  ZSTD_frameSizeInfo frameSizeInfo;
  ZSTD_frameHeader zfh;
  
  lVar5 = 0;
  uVar4 = 0;
  while( true ) {
    if (srcSize == 0) {
      return lVar5 + (ulong)uVar4;
    }
    ZSTD_findFrameSizeInfo(&frameSizeInfo,src,srcSize);
    uVar2 = frameSizeInfo.decompressedBound;
    sVar1 = frameSizeInfo.compressedSize;
    sVar3 = ZSTD_getFrameHeader(&zfh,src,srcSize);
    if (0xffffffffffffff88 < sVar3) {
      return sVar3;
    }
    if ((0xffffffffffffff88 < sVar1) || (uVar2 == 0xfffffffffffffffe)) {
      return 0xffffffffffffffec;
    }
    if (zfh.frameType == ZSTD_skippableFrame) {
      lVar5 = lVar5 + sVar1;
    }
    else {
      if (zfh.frameType != ZSTD_frame) {
        __assert_fail("zfh.frameType == ZSTD_skippableFrame",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9ea5,"size_t ZSTD_decompressionMargin(const void *, size_t)");
      }
      lVar5 = frameSizeInfo.nbBlocks * 3 +
              (ulong)(zfh.checksumFlag != 0) * 4 + lVar5 + (ulong)zfh.headerSize;
      if (uVar4 <= zfh.blockSizeMax) {
        uVar4 = zfh.blockSizeMax;
      }
    }
    bVar6 = srcSize < sVar1;
    srcSize = srcSize - sVar1;
    if (bVar6) break;
    src = (void *)((long)src + sVar1);
  }
  __assert_fail("srcSize >= compressedSize",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x9eaa,"size_t ZSTD_decompressionMargin(const void *, size_t)");
}

Assistant:

size_t ZSTD_decompressionMargin(void const* src, size_t srcSize)
{
    size_t margin = 0;
    unsigned maxBlockSize = 0;

    /* Iterate over each frame */
    while (srcSize > 0) {
        ZSTD_frameSizeInfo const frameSizeInfo = ZSTD_findFrameSizeInfo(src, srcSize);
        size_t const compressedSize = frameSizeInfo.compressedSize;
        unsigned long long const decompressedBound = frameSizeInfo.decompressedBound;
        ZSTD_frameHeader zfh;

        FORWARD_IF_ERROR(ZSTD_getFrameHeader(&zfh, src, srcSize), "");
        if (ZSTD_isError(compressedSize) || decompressedBound == ZSTD_CONTENTSIZE_ERROR)
            return ERROR(corruption_detected);

        if (zfh.frameType == ZSTD_frame) {
            /* Add the frame header to our margin */
            margin += zfh.headerSize;
            /* Add the checksum to our margin */
            margin += zfh.checksumFlag ? 4 : 0;
            /* Add 3 bytes per block */
            margin += 3 * frameSizeInfo.nbBlocks;

            /* Compute the max block size */
            maxBlockSize = MAX(maxBlockSize, zfh.blockSizeMax);
        } else {
            assert(zfh.frameType == ZSTD_skippableFrame);
            /* Add the entire skippable frame size to our margin. */
            margin += compressedSize;
        }

        assert(srcSize >= compressedSize);
        src = (const BYTE*)src + compressedSize;
        srcSize -= compressedSize;
    }

    /* Add the max block size back to the margin. */
    margin += maxBlockSize;

    return margin;
}